

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 __thiscall ninx::parser::Parser::parse_function_definition(Parser *this)

{
  Token *pTVar1;
  bool bVar2;
  int iVar3;
  ParserException *pPVar4;
  type pbVar5;
  string *in_RSI;
  undefined1 local_188 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  function_body;
  string local_178;
  undefined1 local_152;
  allocator local_151;
  string local_150;
  Token *local_130;
  Token *error_token;
  undefined1 local_120 [8];
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  argument;
  undefined1 local_110 [4];
  int result;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  arguments;
  string local_f0;
  undefined1 local_d0 [8];
  string id;
  string local_a8;
  undefined1 local_88 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  Token *local_20;
  Token *id_token;
  Parser *this_local;
  __single_object *function_definition;
  
  this_local = this;
  local_20 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
  if (local_20 == (Token *)0x0) {
    local_55 = 1;
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Expected function name, but could not find one.",&local_41);
    exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_40);
    local_55 = 0;
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  iVar3 = (*local_20->_vptr_Token[2])();
  if (iVar3 != 0) {
    id_ptr._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._6_1_ = 1;
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"Function name must be alphanumeric, and begin with a letter.",
               (allocator *)
               ((long)&id_ptr._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 7));
    exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_78);
    id_ptr._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._6_1_ = 0;
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  if (local_20 != (Token *)0x0) {
    __dynamic_cast(local_20,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
  }
  lexer::token::Text::get_identifier_abi_cxx11_((Text *)local_88);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
  if (!bVar2) {
    id.field_2._M_local_buf[0xe] = '\x01';
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,
               "Invalid function name. It must be alphanumeric, and begin with a letter.",
               (allocator *)(id.field_2._M_local_buf + 0xf));
    exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_a8);
    id.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  pbVar5 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88);
  std::__cxx11::string::string((string *)local_d0,(string *)pbVar5);
  iVar3 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'(');
  if (iVar3 != 1) {
    arguments.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f0,"Expected \'(\' but could not find one.",
               (allocator *)
               ((long)&arguments.
                       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_f0);
    arguments.
    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  TokenReader::get_token((TokenReader *)(in_RSI + 1));
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
            *)local_110);
  do {
    argument._M_t.
    super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
    .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl._4_4_ =
         TokenReader::check_limiter((TokenReader *)(in_RSI + 1),')');
    if (argument._M_t.
        super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
        .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl._4_4_
        != 0) break;
    parse_function_argument((Parser *)local_120);
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ::push_back((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                 *)local_110,(value_type *)local_120);
    iVar3 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),',');
    if (iVar3 == 1) {
      TokenReader::get_token((TokenReader *)(in_RSI + 1));
      error_token._4_4_ = 0;
    }
    else {
      iVar3 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),')');
      if (iVar3 != 1) {
        local_130 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
        local_152 = 1;
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        pTVar1 = local_130;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,"Another argument or end of arguments expected.",&local_151)
        ;
        exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_150);
        local_152 = 0;
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                    exception::ParserException::~ParserException);
      }
      error_token._4_4_ = 3;
    }
    std::
    unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
    ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                   *)local_120);
  } while (error_token._4_4_ == 0);
  TokenReader::get_token((TokenReader *)(in_RSI + 1));
  if (argument._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl._4_4_ ==
      -1) {
    function_body._M_t.
    super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl._6_1_ = 1;
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_178,"Expected \')\' but EOF has been reached.",
               (allocator *)
               ((long)&function_body._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                       .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl +
               7));
    exception::ParserException::ParserException(pPVar4,(Token *)0x0,in_RSI,&local_178);
    function_body._M_t.
    super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  parse_block((Parser *)local_188);
  std::
  make_unique<ninx::parser::element::FunctionDefinition,std::__cxx11::string&,std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            (&this->origin,
             (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
              *)local_d0,
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)local_110);
  error_token._4_4_ = 1;
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_188);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
             *)local_110);
  std::__cxx11::string::~string((string *)local_d0);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
  return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionDefinition> ninx::parser::Parser::parse_function_definition() {
    // Extract the function definition identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected function name, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Function name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the parameters
    if (reader.check_limiter('(') != 1) {
        throw ParserException(id_token, this->origin, "Expected '(' but could not find one.");
    }
    reader.get_token();

    std::vector<std::unique_ptr<FunctionArgument>> arguments;

    // Cycle until a closing parenthesis is found or EOF is reached
    int result;
    while ((result = reader.check_limiter(')')) == 0) {
        auto argument{parse_function_argument()};

        arguments.push_back(std::move(argument));

        if (reader.check_limiter(',') == 1) {
            // Skip the period limiter
            reader.get_token();
        } else if (reader.check_limiter(')') == 1) {
            break;
        } else {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
        }
    }
    reader.get_token(); // Skip the closing parenthesis
    if (result == -1) {
        throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
    }

    // Parse the function block
    auto function_body{parse_block()};

    auto function_definition = std::make_unique<FunctionDefinition>(id, std::move(arguments), std::move(function_body));

    return function_definition;
}